

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vreg_assignment.cpp
# Opt level: O3

int __thiscall mocker::VRegAssignment::init(VRegAssignment *this,EVP_PKEY_CTX *ctx)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar1;
  shared_ptr<mocker::ir::Addr> *psVar2;
  Register *pRVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  long *plVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  size_type *psVar8;
  EVP_PKEY_CTX *pEVar9;
  shared_ptr<mocker::ir::Addr> *addr;
  EVP_PKEY_CTX *pEVar10;
  shared_ptr<mocker::ir::Reg> reg;
  shared_ptr<mocker::ir::Reg> dest;
  undefined1 local_b9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  EVP_PKEY_CTX *local_b0;
  Register *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  EVP_PKEY_CTX *local_78;
  EVP_PKEY_CTX *local_70;
  EVP_PKEY_CTX *local_68;
  long local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b0 = *(EVP_PKEY_CTX **)(ctx + 0x38);
  local_78 = ctx + 0x38;
  if (local_b0 != local_78) {
    do {
      pEVar10 = local_b0 + 0x18;
      for (pEVar9 = *(EVP_PKEY_CTX **)(local_b0 + 0x18); pEVar9 != pEVar10;
          pEVar9 = *(EVP_PKEY_CTX **)pEVar9) {
        ir::getDest((ir *)&local_60,(shared_ptr<mocker::ir::IRInst> *)(pEVar9 + 0x10));
        if (local_60 != 0) {
          std::operator+(&local_50,"vir_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_60 + 8));
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
          psVar8 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_98.field_2._M_allocated_capacity = *psVar8;
            local_98.field_2._8_8_ = plVar5[3];
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          }
          else {
            local_98.field_2._M_allocated_capacity = *psVar8;
            local_98._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_98._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          local_a8 = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,std::__cxx11::string>
                    (&_Stack_a0,&local_a8,(allocator<mocker::nasm::Register> *)&local_b9,&local_98);
          pmVar6 = std::__detail::
                   _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this,(key_type *)&local_60);
          _Var4._M_pi = _Stack_a0._M_pi;
          pRVar3 = local_a8;
          local_a8 = (Register *)0x0;
          _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_00 = (pmVar6->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_refcount._M_pi;
          (pmVar6->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
               pRVar3;
          (pmVar6->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi = _Var4._M_pi;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
        }
      }
      local_b0 = *(EVP_PKEY_CTX **)local_b0;
    } while (local_b0 != local_78);
    local_b0 = *(EVP_PKEY_CTX **)local_78;
  }
  if (local_b0 != local_78) {
    do {
      local_68 = local_b0 + 0x18;
      pEVar10 = *(EVP_PKEY_CTX **)(local_b0 + 0x18);
      if (pEVar10 != local_68) {
        do {
          lVar1 = *(long *)(pEVar10 + 0x10);
          if (*(int *)(lVar1 + 8) == 0xf) {
            local_b8 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pEVar10 + 0x18);
            if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_b8->_M_use_count = local_b8->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_b8->_M_use_count = local_b8->_M_use_count + 1;
              }
            }
            addr = *(shared_ptr<mocker::ir::Addr> **)(lVar1 + 0x28);
            psVar2 = *(shared_ptr<mocker::ir::Addr> **)(lVar1 + 0x30);
            local_70 = pEVar10;
            if (addr != psVar2) {
              do {
                ir::dycLocalReg((ir *)&local_98,addr);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_98._M_dataplus._M_p ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  __assert_fail("reg",
                                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/vreg_assignment.cpp"
                                ,0x1c,
                                "void mocker::VRegAssignment::init(const ir::FunctionModule &)");
                }
                pmVar6 = std::__detail::
                         _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)this,(key_type *)&local_98);
                pmVar7 = std::__detail::
                         _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)this,(key_type *)(lVar1 + 0x18));
                if ((pmVar6->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_ptr !=
                    (pmVar7->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_ptr) {
                  pmVar6 = std::__detail::
                           _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                         *)this,(key_type *)(lVar1 + 0x18));
                  pmVar7 = std::__detail::
                           _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                         *)this,(key_type *)&local_98);
                  (pmVar7->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr = (pmVar6->
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr;
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                            (&(pmVar7->
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              )._M_refcount,
                             &(pmVar6->
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              )._M_refcount);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_98._M_string_length);
                }
                addr = addr + 2;
              } while (addr != psVar2);
            }
            pEVar10 = local_70;
            if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
            }
          }
          pEVar10 = *(EVP_PKEY_CTX **)pEVar10;
        } while (pEVar10 != local_68);
      }
      local_b0 = *(EVP_PKEY_CTX **)local_b0;
    } while (local_b0 != local_78);
  }
  return (int)local_b0;
}

Assistant:

void VRegAssignment::init(const ir::FunctionModule &func) {
  for (auto &bb : func.getBBs()) {
    for (auto &inst : bb.getInsts()) {
      auto dest = ir::getDest(inst);
      if (!dest)
        continue;
      mp[dest] = std::make_shared<nasm::Register>("vir_" +
          dest->getIdentifier() + "_");
    }
  }

  for (auto &bb : func.getBBs()) {
    for (auto &inst : bb.getInsts()) {
      auto phi = ir::dyc<ir::Phi>(inst);
      if (!phi)
        continue;

      for (auto &option : phi->getOptions()) {
        auto reg = ir::dycLocalReg(option.first);
        assert(reg);
        if (mp[reg] != mp[phi->getDest()]) {
          mp[reg] = mp[phi->getDest()];
        }
      }
    }
  }
}